

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall ncnn::Convolution_x86::forward(Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob)

{
  int iVar1;
  code *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Mat bottom_blob_bordered;
  
  if (bottom_blob->dims != 3) {
LAB_0010a5ef:
    iVar3 = Convolution::forward(&this->super_Convolution,bottom_blob,top_blob);
    return iVar3;
  }
  iVar3 = (this->super_Convolution).kernel_w;
  if (iVar3 != (this->super_Convolution).kernel_h) goto LAB_0010a5ef;
  iVar1 = (this->super_Convolution).stride_w;
  if ((((iVar1 != (this->super_Convolution).stride_h) || (5 < iVar1 || 5 < iVar3)) ||
      (iVar6 = (this->super_Convolution).dilation_w, iVar6 != (this->super_Convolution).dilation_h))
     || (pcVar2 = (code *)(&PTR_forward_inplace_001318b0)[(long)iVar3 * 5 + (long)iVar1],
        pcVar2 == (code *)0x0)) goto LAB_0010a5ef;
  if (iVar6 != 1) {
    iVar3 = (*(this->super_Convolution).super_Layer._vptr_Layer[8])(this,bottom_blob,top_blob);
    return iVar3;
  }
  iVar6 = bottom_blob->w;
  iVar5 = bottom_blob->h;
  Mat::Mat(&bottom_blob_bordered,bottom_blob);
  iVar4 = (this->super_Convolution).pad_w;
  iVar7 = (this->super_Convolution).pad_h;
  if (iVar7 < 1 && iVar4 < 1) {
    if (iVar7 == -0xe9 && iVar4 == -0xe9) {
      iVar7 = ~((iVar6 + -1) % iVar1) + iVar3;
      iVar4 = ~((iVar5 + -1) % iVar1) + iVar3;
      if ((0 < iVar7) || (iVar6 = bottom_blob_bordered.w, iVar5 = bottom_blob_bordered.h, 0 < iVar4)
         ) {
        copy_make_border(bottom_blob,&bottom_blob_bordered,iVar4 / 2,iVar4 - iVar4 / 2,iVar7 / 2,
                         iVar7 - iVar7 / 2,0,0.0);
        goto LAB_0010a5cb;
      }
    }
  }
  else {
    copy_make_border(bottom_blob,&bottom_blob_bordered,iVar7,iVar7,iVar4,iVar4,0,0.0);
LAB_0010a5cb:
    if ((bottom_blob_bordered.data == (void *)0x0) ||
       (iVar6 = bottom_blob_bordered.w, iVar5 = bottom_blob_bordered.h,
       (long)bottom_blob_bordered.c * bottom_blob_bordered.cstep == 0)) {
      iVar3 = -100;
      goto LAB_0010a6dc;
    }
  }
  Mat::create(top_blob,(iVar6 - iVar3) / iVar1 + 1,(iVar5 - iVar3) / iVar1 + 1,
              (this->super_Convolution).num_output,4);
  iVar3 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar3 = 0;
    (*pcVar2)(&bottom_blob_bordered,top_blob,&(this->super_Convolution).weight_data,
              &(this->super_Convolution).bias_data);
  }
LAB_0010a6dc:
  Mat::~Mat(&bottom_blob_bordered);
  return iVar3;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (bottom_blob.dims != 3)
    {
        return Convolution::forward(bottom_blob, top_blob);
    }

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Convolution::forward(bottom_blob, top_blob);
    }

    const int kernel_size = kernel_w;
    const int stride = stride_w;

    if (kernel_size > 5 || stride > 5 || dilation_w != dilation_h)
    {
        return Convolution::forward(bottom_blob, top_blob);
    }

    typedef void (*conv_func)(const Mat&, Mat&, const Mat&, const Mat&);

    // kernel_size x stride
    conv_func conv_func_table[5][5] =
    {
        {
            conv1x1s1_sse,
            conv1x1s2_sse,
            0,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_sse,
            0,
            0,
            0,
            0
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {
            conv5x5s1_sse,
            0,
            0,
            0,
            0
        }  // kernel_size = 5
    };

    conv_func conv = conv_func_table[kernel_size-1][stride-1];
    if (!conv)
    {
        return Convolution::forward(bottom_blob, top_blob);
    }

    if (dilation_w != 1) {
        return forwardDilation(bottom_blob, top_blob, conv);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_size + (w - 1) / stride * stride - w;
        int hpad = kernel_size + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_size) / stride + 1;
    int outh = (h - kernel_size) / stride + 1;

    top_blob.create(outw, outh, num_output);
    if (top_blob.empty())
        return -100;

    conv(bottom_blob_bordered, top_blob, weight_data, bias_data);

    return 0;
}